

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayKernel.cc
# Opt level: O2

void __thiscall OpenMesh::ArrayKernel::garbage_collection(ArrayKernel *this,bool _v,bool _e,bool _f)

{
  undefined1 auStack_68 [8];
  vector<OpenMesh::VertexHandle_*,_std::allocator<OpenMesh::VertexHandle_*>_> empty_vh;
  undefined1 auStack_48 [8];
  vector<OpenMesh::HalfedgeHandle_*,_std::allocator<OpenMesh::HalfedgeHandle_*>_> empty_hh;
  undefined1 auStack_28 [8];
  vector<OpenMesh::FaceHandle_*,_std::allocator<OpenMesh::FaceHandle_*>_> empty_fh;
  
  empty_vh.super__Vector_base<OpenMesh::VertexHandle_*,_std::allocator<OpenMesh::VertexHandle_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_68 = (undefined1  [8])0x0;
  empty_vh.super__Vector_base<OpenMesh::VertexHandle_*,_std::allocator<OpenMesh::VertexHandle_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  auStack_48 = (undefined1  [8])0x0;
  empty_hh.
  super__Vector_base<OpenMesh::HalfedgeHandle_*,_std::allocator<OpenMesh::HalfedgeHandle_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  empty_hh.
  super__Vector_base<OpenMesh::HalfedgeHandle_*,_std::allocator<OpenMesh::HalfedgeHandle_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_28 = (undefined1  [8])0x0;
  empty_fh.super__Vector_base<OpenMesh::FaceHandle_*,_std::allocator<OpenMesh::FaceHandle_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  empty_fh.super__Vector_base<OpenMesh::FaceHandle_*,_std::allocator<OpenMesh::FaceHandle_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  garbage_collection<std::vector<OpenMesh::VertexHandle*,std::allocator<OpenMesh::VertexHandle*>>,std::vector<OpenMesh::HalfedgeHandle*,std::allocator<OpenMesh::HalfedgeHandle*>>,std::vector<OpenMesh::FaceHandle*,std::allocator<OpenMesh::FaceHandle*>>>
            (this,(vector<OpenMesh::VertexHandle_*,_std::allocator<OpenMesh::VertexHandle_*>_> *)
                  auStack_68,
             (vector<OpenMesh::HalfedgeHandle_*,_std::allocator<OpenMesh::HalfedgeHandle_*>_> *)
             auStack_48,
             (vector<OpenMesh::FaceHandle_*,_std::allocator<OpenMesh::FaceHandle_*>_> *)auStack_28,
             _v,_e,_f);
  std::_Vector_base<OpenMesh::FaceHandle_*,_std::allocator<OpenMesh::FaceHandle_*>_>::~_Vector_base
            ((_Vector_base<OpenMesh::FaceHandle_*,_std::allocator<OpenMesh::FaceHandle_*>_> *)
             auStack_28);
  std::_Vector_base<OpenMesh::HalfedgeHandle_*,_std::allocator<OpenMesh::HalfedgeHandle_*>_>::
  ~_Vector_base((_Vector_base<OpenMesh::HalfedgeHandle_*,_std::allocator<OpenMesh::HalfedgeHandle_*>_>
                 *)auStack_48);
  std::_Vector_base<OpenMesh::VertexHandle_*,_std::allocator<OpenMesh::VertexHandle_*>_>::
  ~_Vector_base((_Vector_base<OpenMesh::VertexHandle_*,_std::allocator<OpenMesh::VertexHandle_*>_> *
                )auStack_68);
  return;
}

Assistant:

void ArrayKernel::garbage_collection(bool _v, bool _e, bool _f)
{
  std::vector<VertexHandle*> empty_vh;
  std::vector<HalfedgeHandle*> empty_hh;
  std::vector<FaceHandle*> empty_fh;
  garbage_collection( empty_vh,empty_hh,empty_fh,_v, _e, _f);
}